

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall
duckdb_re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  uint uVar1;
  size_type sVar2;
  ostream *poVar3;
  size_t sVar4;
  int iVar5;
  bool bVar6;
  char *pcVar7;
  char *pcVar8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  sVar2 = rewrite->size_;
  bVar6 = (long)sVar2 < 1;
  if (0 < (long)sVar2) {
    pcVar8 = rewrite->data_;
    pcVar7 = pcVar8 + sVar2;
    do {
      if (*pcVar8 == '\\') {
        pcVar8 = pcVar8 + 1;
        iVar5 = -1;
        if (pcVar8 < pcVar7) {
          iVar5 = (int)*pcVar8;
        }
        uVar1 = iVar5 - 0x30;
        if (9 < uVar1) {
          if (iVar5 != 0x5c) {
            if ((this->options_).log_errors_ != true) {
              return bVar6;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"invalid rewrite pattern: ",0x19);
            pcVar8 = rewrite->data_;
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(local_1a8[0] + -0x18) +
                              (int)(ostringstream *)local_1a8);
            }
            else {
              sVar4 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar4);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            return bVar6;
          }
          goto LAB_0047faab;
        }
        if ((int)uVar1 < veclen) {
          if (vec[uVar1].size_ != 0) {
            std::__cxx11::string::append((char *)out,(ulong)vec[uVar1].data_);
          }
        }
        else if ((this->options_).log_errors_ == true) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"invalid substitution \\",0x16);
          poVar3 = (ostream *)std::ostream::operator<<(local_1a8,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," from ",6);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,veclen);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," groups",7);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        if (veclen <= (int)uVar1) {
          return bVar6;
        }
      }
      else {
LAB_0047faab:
        std::__cxx11::string::push_back((char)out);
      }
      pcVar8 = pcVar8 + 1;
      bVar6 = pcVar8 >= pcVar7;
    } while (pcVar8 < pcVar7);
  }
  return bVar6;
}

Assistant:

bool RE2::Rewrite(std::string* out,
                  const StringPiece& rewrite,
                  const StringPiece* vec,
                  int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "invalid substitution \\" << n
                     << " from " << veclen << " groups";
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (!snip.empty())
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}